

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# broadcast.cpp
# Opt level: O0

void onClose(Ptr *ss)

{
  element_type *peVar1;
  anon_class_4_1_3fcf657c_for__M_f local_18;
  int local_14;
  Ptr *pPStack_10;
  int fd;
  Ptr *ss_local;
  
  pPStack_10 = ss;
  peVar1 = std::__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)ss);
  local_18.fd = (*(peVar1->super_Task)._vptr_Task[4])();
  local_14 = local_18.fd;
  hwnet::ThreadPool::PostClosure<onClose(std::shared_ptr<hwnet::TCPSocket>const&)::__0>
            (&mainThread,&local_18);
  printf("onClose\n");
  return;
}

Assistant:

void onClose(const TCPSocket::Ptr &ss) {
	auto fd = ss->Fd();
	mainThread.PostClosure([fd](){
		for(size_t i = 0 ; i < clients.size(); i++) {
			if(clients[i]->Fd() == fd) {
				clientcount--;
				swap(clients[i],clients[clients.size()-1]);
				clients.pop_back();
				if(clientcount == 0){
					poller_.Stop();
				}
			}
		}		
	});  
	printf("onClose\n");
}